

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

void mpr_clear_addr_set(avl_tree *set)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  addr_node *node_it;
  addr_node *current_node;
  avl_tree *set_local;
  
  plVar1 = (set->list_head).next;
  node_it = (addr_node *)&plVar1[-2].prev;
  plVar1 = plVar1->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-2].prev;
    if ((node_it->_avl_node).list.prev == (set->list_head).prev) break;
    avl_remove(set,&node_it->_avl_node);
    free(node_it);
    node_it = (addr_node *)__tempptr;
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
mpr_clear_addr_set(struct avl_tree *set) {
  struct addr_node *current_node, *node_it;

  avl_for_each_element_safe(set, current_node, _avl_node, node_it) {
    avl_remove(set, &current_node->_avl_node);
    free(current_node);
  }
}